

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall
BasicBlock::RemoveSucc
          (BasicBlock *this,BasicBlock *block,FlowGraph *graph,bool doCleanPred,bool moveToDead)

{
  undefined1 *puVar1;
  RealCount *pRVar2;
  Type pSVar3;
  code *pcVar4;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *buffer;
  bool bVar5;
  Loop *loop;
  Type *ppFVar6;
  NodeBase *pNVar7;
  undefined4 *puVar8;
  undefined1 local_58 [8];
  EditingIterator iter;
  
  local_58 = (undefined1  [8])&this->succList;
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_58;
  do {
    bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)local_58);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xc9d,"((0))","Edge not found.");
      if (bVar5) {
        *puVar8 = 0;
        return;
      }
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    ppFVar6 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_58);
    buffer = iter.super_Iterator.list;
  } while ((*ppFVar6)->succBlock != block);
  if (moveToDead) {
    pNVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
             UnlinkCurrentNode((EditingIterator *)local_58);
    pNVar7->next = (this->deadSuccList).
                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
    (this->deadSuccList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
    super_SListNodeBase<Memory::ArenaAllocator>.next = pNVar7;
    pRVar2 = &(this->deadSuccList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
              super_RealCount;
    pRVar2->count = pRVar2->count + 1;
  }
  else {
    iter.last = (NodeBase *)graph->alloc;
    SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::UnlinkCurrentNode
              ((EditingIterator *)local_58);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)iter.last,
               buffer,0x10);
  }
  if (doCleanPred) {
    RemovePred(block,this,graph,false,moveToDead);
  }
  if (((block->field_0x18 & 4) != 0) && (block->loop != (Loop *)0x0)) {
    pSVar3 = (block->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar3 != &block->predList) &&
       ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar3->next == &block->predList)) {
      puVar1 = &block->loop->field_0x178;
      *puVar1 = *puVar1 | 1;
    }
  }
  return;
}

Assistant:

void
BasicBlock::RemoveSucc(BasicBlock *block, FlowGraph * graph, bool doCleanPred, bool moveToDead)
{
    FOREACH_SLISTBASECOUNTED_ENTRY_EDITING(FlowEdge*, edge, this->GetSuccList(), iter)
    {
        if (edge->GetSucc() == block)
        {
            if (moveToDead)
            {
                iter.MoveCurrentTo(this->GetDeadSuccList());
            }
            else
            {
                iter.RemoveCurrent(graph->alloc);
            }

            if (doCleanPred)
            {
                block->RemovePred(this, graph, false, moveToDead);
            }

            if (block->isLoopHeader && block->loop && block->GetPredList()->HasOne())
            {
                Loop *loop = block->loop;
                loop->isDead = true;
            }
            return;
        }
    } NEXT_SLISTBASECOUNTED_ENTRY_EDITING;
    AssertMsg(UNREACHED, "Edge not found.");
}